

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_hdr_remove(bcf_hdr_t *hdr,int type,char *key)

{
  char cVar1;
  uint uVar2;
  bcf_hrec_t **ppbVar3;
  uint *puVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bcf_hrec_t *pbVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint local_90;
  
  uVar12 = (ulong)(uint)type;
  if (type == 3) {
    uVar12 = 0;
  }
  do {
    if ((uint)type < 4) {
      pbVar10 = bcf_hdr_get_hrec(hdr,type,"ID",key,(char *)0x0);
      if (pbVar10 == (bcf_hrec_t *)0x0) {
        return;
      }
      local_90 = hdr->nhrec;
      if ((int)local_90 < 1) {
LAB_00115326:
        __assert_fail("i<hdr->nhrec",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x269,"void bcf_hdr_remove(bcf_hdr_t *, int, const char *)");
      }
      uVar16 = 0;
      while (hdr->hrec[uVar16] != pbVar10) {
        uVar16 = uVar16 + 1;
        if (local_90 == uVar16) goto LAB_00115326;
      }
      puVar4 = (uint *)hdr->dict[type == 3];
      uVar7 = *puVar4;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar13 = (uint)*key;
        if (*key == '\0') {
          uVar13 = 0;
        }
        else {
          cVar1 = key[1];
          pcVar6 = key + 2;
          while (cVar1 != '\0') {
            uVar13 = (int)cVar1 + uVar13 * 0x1f;
            cVar1 = *pcVar6;
            pcVar6 = pcVar6 + 1;
          }
        }
        uVar13 = uVar13 & uVar7 - 1;
        lVar5 = *(long *)(puVar4 + 4);
        iVar15 = 1;
        uVar14 = uVar13;
        do {
          uVar2 = *(uint *)(lVar5 + (ulong)(uVar14 >> 4) * 4);
          bVar11 = (char)uVar14 * '\x02' & 0x1e;
          uVar8 = uVar2 >> bVar11;
          if (((uVar8 & 2) != 0) ||
             (((uVar8 & 1) == 0 &&
              (iVar9 = strcmp(*(char **)(*(long *)(puVar4 + 6) + (ulong)uVar14 * 8),key), iVar9 == 0
              )))) {
            if ((uVar2 >> bVar11 & 3) == 0) {
              uVar7 = uVar14;
            }
            break;
          }
          uVar14 = uVar14 + iVar15 & uVar7 - 1;
          iVar15 = iVar15 + 1;
        } while (uVar14 != uVar13);
      }
      *(undefined8 *)((ulong)uVar7 * 0x30 + *(long *)(puVar4 + 8) + 0x10 + uVar12 * 8) = 0;
    }
    else {
      local_90 = hdr->nhrec;
      if (0 < (long)(int)local_90) {
        ppbVar3 = hdr->hrec;
        uVar16 = 0;
        do {
          pbVar10 = ppbVar3[uVar16];
          if (pbVar10->type == type) {
            if (type == 5) {
              iVar15 = strcmp(pbVar10->key,key);
            }
            else {
              uVar7 = bcf_hrec_find_key(pbVar10,"ID");
              if ((int)uVar7 < 0) goto LAB_00115173;
              iVar15 = strcmp(pbVar10->vals[uVar7],key);
            }
            if (iVar15 == 0) goto LAB_001151d3;
          }
LAB_00115173:
          uVar16 = uVar16 + 1;
          if ((long)(int)local_90 == uVar16) {
            return;
          }
        } while( true );
      }
      uVar16 = 0;
LAB_001151d3:
      if ((uint)uVar16 == local_90) {
        return;
      }
      pbVar10 = hdr->hrec[uVar16 & 0xffffffff];
    }
    iVar15 = local_90 - 1;
    hdr->nhrec = iVar15;
    iVar9 = iVar15 - (int)uVar16;
    if (iVar9 != 0 && (int)uVar16 <= iVar15) {
      memmove(hdr->hrec + (uVar16 & 0xffffffff),hdr->hrec + (uVar16 & 0xffffffff) + 1,
              (long)iVar9 << 3);
    }
    bcf_hrec_destroy(pbVar10);
    hdr->dirty = 1;
  } while( true );
}

Assistant:

void bcf_hdr_remove(bcf_hdr_t *hdr, int type, const char *key)
{
    int i;
    bcf_hrec_t *hrec;
    while (1)
    {
        if ( type==BCF_HL_FLT || type==BCF_HL_INFO || type==BCF_HL_FMT || type== BCF_HL_CTG )
        {
            hrec = bcf_hdr_get_hrec(hdr, type, "ID", key, NULL);
            if ( !hrec ) return;

            for (i=0; i<hdr->nhrec; i++)
                if ( hdr->hrec[i]==hrec ) break;
            assert( i<hdr->nhrec );

            vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
            khint_t k = kh_get(vdict, d, key);
            kh_val(d, k).hrec[type==BCF_HL_CTG?0:type] = NULL;
        }
        else
        {
            for (i=0; i<hdr->nhrec; i++)
            {
                if ( hdr->hrec[i]->type!=type ) continue;
                if ( type==BCF_HL_GEN )
                {
                    if ( !strcmp(hdr->hrec[i]->key,key) ) break;
                }
                else
                {
                    // not all structured lines have ID, we could be more sophisticated as in bcf_hdr_get_hrec()
                    int j = bcf_hrec_find_key(hdr->hrec[i], "ID");
                    if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],key) ) break;
                }
            }
            if ( i==hdr->nhrec ) return;
            hrec = hdr->hrec[i];
        }

        hdr->nhrec--;
        if ( i < hdr->nhrec )
            memmove(&hdr->hrec[i],&hdr->hrec[i+1],(hdr->nhrec-i)*sizeof(bcf_hrec_t*));
        bcf_hrec_destroy(hrec);
        hdr->dirty = 1;
    }
}